

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **data;
  libssh2_nonblocking_states lVar1;
  uint8_t *private_key;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  EVP_MD_CTX *ctx;
  int iVar5;
  uint uVar6;
  int iVar7;
  BIGNUM *pBVar8;
  uchar *puVar9;
  uchar *puVar10;
  LIBSSH2_CRYPT_METHOD *pLVar11;
  _LIBSSH2_MAC_METHOD *p_Var12;
  LIBSSH2_COMP_METHOD *pLVar13;
  size_t sVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  uchar *puVar18;
  EVP_MD_CTX *ctx_00;
  size_t sVar19;
  EVP_MD_CTX *fingerprint_ctx;
  uchar *s;
  uchar *local_68;
  ulong local_60;
  uchar *server_public_key;
  uchar *server_host_key;
  size_t server_public_key_len;
  uchar *local_40;
  size_t hostkey_len;
  
  iVar5 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    break;
  default:
    goto switchD_00113c66_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_00113c66_caseD_2;
  case libssh2_NB_state_sent:
    sVar14 = key_state->request_len;
    goto LAB_00113d37;
  case libssh2_NB_state_sent1:
    goto switchD_00113c66_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00113c66_caseD_5;
  }
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_00113c66_caseD_2:
  s = (uchar *)0x0;
  pcVar15 = session->kex->name;
  iVar5 = strcmp(pcVar15,"curve25519-sha256@libssh.org");
  if ((iVar5 != 0) && (iVar5 = strcmp(pcVar15,"curve25519-sha256"), iVar5 != 0)) {
    pcVar15 = "Unknown KEX curve25519 curve type";
    iVar5 = -1;
LAB_00113e77:
    iVar5 = _libssh2_error(session,iVar5,pcVar15);
    goto switchD_00113c66_caseD_1;
  }
  iVar5 = _libssh2_curve25519_new
                    (session,&key_state->curve25519_public_key,&key_state->curve25519_private_key);
  if (iVar5 != 0) {
    pcVar15 = "Unable to create private key";
    goto LAB_00113e77;
  }
  key_state->request[0] = '\x1e';
  s = key_state->request + 1;
  _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
  key_state->request_len = 0x25;
  key_state->state = libssh2_NB_state_sent;
  sVar14 = 0x25;
LAB_00113d37:
  iVar5 = _libssh2_transport_send(session,key_state->request,sVar14,(uchar *)0x0,0);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 != 0) {
    pcVar15 = "Unable to send ECDH_INIT";
    goto LAB_00113e77;
  }
  key_state->state = libssh2_NB_state_sent1;
switchD_00113c66_caseD_4:
  iVar5 = _libssh2_packet_require
                    (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                     &key_state->req_state);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 != 0) {
    pcVar15 = "Timeout waiting for ECDH_REPLY reply";
    goto LAB_00113e77;
  }
  key_state->state = libssh2_NB_state_sent2;
switchD_00113c66_caseD_5:
  uVar16 = key_state->data_len;
  if (uVar16 < 5) {
    iVar5 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    lVar1 = (key_state->exchange_state).state;
    iVar5 = 0;
    if (libssh2_NB_state_sent2 < lVar1) goto switchD_00113e07_caseD_1;
    puVar9 = key_state->data;
    puVar10 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    switch(lVar1) {
    case libssh2_NB_state_idle:
      pBVar8 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar8;
      (key_state->exchange_state).state = libssh2_NB_state_created;
      break;
    default:
      goto switchD_00113e07_caseD_1;
    case libssh2_NB_state_created:
      break;
    case libssh2_NB_state_sent:
      goto switchD_00113e07_caseD_3;
    case libssh2_NB_state_sent2:
      goto switchD_00113e07_caseD_5;
    }
    local_68 = puVar9 + 1;
    s = puVar9;
    local_60 = uVar16;
    local_40 = puVar10;
    iVar5 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
    if (iVar5 != 0) {
      pcVar15 = "Unexpected curve25519 key length 2";
LAB_00113e54:
      iVar5 = -0xe;
      goto LAB_001148e0;
    }
    session->server_hostkey_len = (uint32_t)hostkey_len;
    puVar9 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
    session->server_hostkey = puVar9;
    if (puVar9 == (uchar *)0x0) {
      pcVar15 = "Unable to allocate memory for a copy of the host curve25519 key";
      goto LAB_00113fa7;
    }
    memcpy(puVar9,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
           (ulong)session->server_hostkey_len);
    iVar5 = _libssh2_md5_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_md5,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_md5_valid = (uint)(iVar5 != 0);
    iVar5 = _libssh2_sha1_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha1,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha1_valid = (uint)(iVar5 != 0);
    iVar5 = _libssh2_sha256_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha256,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha256_valid = (uint)(iVar5 != 0);
    iVar5 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar5 != 0) {
      pcVar15 = "Unable to initialize hostkey importer curve25519";
      goto LAB_00113fed;
    }
    iVar5 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
    if (iVar5 != 0) {
      pcVar15 = "Unexpected curve25519 key length";
      goto LAB_00113e54;
    }
    if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
      iVar5 = _libssh2_get_string((string_buf *)&s,&(key_state->exchange_state).h_sig,
                                  &(key_state->exchange_state).h_sig_len);
      if (iVar5 != 0) {
        pcVar15 = "Unexpected curve25519 server sig length";
        goto LAB_00113fed;
      }
      iVar5 = _libssh2_curve25519_gen_k
                        (&(key_state->exchange_state).k,private_key,
                         (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
      if (iVar5 != 0) {
        pcVar15 = "Unable to create curve25519 shared secret";
        iVar5 = -5;
        goto LAB_001148e0;
      }
      iVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      iVar5 = iVar7 + 0xe;
      if (-1 < iVar7 + 7) {
        iVar5 = iVar7 + 7;
      }
      (key_state->exchange_state).k_value_len = (long)((iVar5 >> 3) + 5);
      uVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      sVar14 = (key_state->exchange_state).k_value_len;
      if ((uVar6 & 7) != 0) {
        sVar14 = sVar14 - 1;
        (key_state->exchange_state).k_value_len = sVar14;
      }
      puVar9 = (uchar *)(*session->alloc)(sVar14,&session->abstract);
      (key_state->exchange_state).k_value = puVar9;
      if (puVar9 == (uchar *)0x0) {
        pcVar15 = "Unable to allocate buffer for K";
LAB_00113fa7:
        iVar5 = -6;
        goto LAB_001148e0;
      }
      _libssh2_htonu32(puVar9,(int)(key_state->exchange_state).k_value_len - 4);
      uVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      lVar17 = 4;
      if ((uVar6 & 7) == 0) {
        (key_state->exchange_state).k_value[4] = '\0';
        lVar17 = 5;
      }
      BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,(key_state->exchange_state).k_value + lVar17
               );
      (key_state->exchange_state).exchange_hash = &fingerprint_ctx;
      _libssh2_sha256_init(&fingerprint_ctx);
      puVar10 = (session->local).banner;
      puVar9 = (key_state->exchange_state).h_sig_comp;
      if (puVar10 == (uchar *)0x0) {
        _libssh2_htonu32(puVar9,0x16);
        EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
        pcVar15 = "SSH-2.0-libssh2_1.11.0";
        sVar19 = 0x16;
        ctx_00 = (EVP_MD_CTX *)fingerprint_ctx;
      }
      else {
        sVar19 = strlen((char *)puVar10);
        _libssh2_htonu32(puVar9,(int)sVar19 - 2);
        EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
        ctx_00 = (EVP_MD_CTX *)fingerprint_ctx;
        pcVar15 = (char *)(session->local).banner;
        sVar19 = strlen(pcVar15);
        sVar19 = sVar19 - 2;
      }
      EVP_DigestUpdate(ctx_00,pcVar15,sVar19);
      sVar19 = strlen((char *)(session->remote).banner);
      _libssh2_htonu32(puVar9,(uint32_t)sVar19);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      ctx = fingerprint_ctx;
      puVar10 = (session->remote).banner;
      sVar19 = strlen((char *)puVar10);
      EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar10,sVar19);
      _libssh2_htonu32(puVar9,(uint32_t)(session->local).kexinit_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                       (session->local).kexinit_len);
      _libssh2_htonu32(puVar9,(uint32_t)(session->remote).kexinit_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                       (session->remote).kexinit_len);
      _libssh2_htonu32(puVar9,session->server_hostkey_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      _libssh2_htonu32(puVar9,0x20);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,local_40,0x20);
      _libssh2_htonu32(puVar9,(uint32_t)server_public_key_len);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar9,4);
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                       (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                       CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                       (key_state->exchange_state).k_value_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar9,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
      iVar5 = (*session->hostkey->sig_verify)
                        (session,(key_state->exchange_state).h_sig,
                         (key_state->exchange_state).h_sig_len,puVar9,0x20,
                         &session->server_hostkey_abstract);
      if (iVar5 != 0) {
        pcVar15 = "Unable to verify hostkey signature curve25519";
        iVar5 = -0xb;
        goto LAB_001148e0;
      }
      (key_state->exchange_state).c = '\x15';
      (key_state->exchange_state).state = libssh2_NB_state_sent;
switchD_00113e07_caseD_3:
      iVar5 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
      if (iVar5 == -0x25) {
        return -0x25;
      }
      if (iVar5 != 0) {
        pcVar15 = "Unable to send NEWKEYS message curve25519";
        goto LAB_001148e0;
      }
      (key_state->exchange_state).state = libssh2_NB_state_sent2;
switchD_00113e07_caseD_5:
      data = &(key_state->exchange_state).tmp;
      iVar5 = _libssh2_packet_require
                        (session,'\x15',data,&(key_state->exchange_state).tmp_len,0,(uchar *)0x0,0,
                         &(key_state->exchange_state).req_state);
      if (iVar5 == -0x25) {
        return -0x25;
      }
      if (iVar5 != 0) {
        pcVar15 = "Timed out waiting for NEWKEYS curve25519";
        goto LAB_001148e0;
      }
      *(byte *)&session->state = (byte)session->state | 2;
      (*session->free)(*data,&session->abstract);
      if (session->session_id == (uchar *)0x0) {
        puVar9 = (uchar *)(*session->alloc)(0x20,&session->abstract);
        session->session_id = puVar9;
        if (puVar9 == (uchar *)0x0) {
          pcVar15 = "Unable to allocate buffer for SHA digest";
          goto LAB_00113fa7;
        }
        uVar2 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
        uVar3 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
        uVar4 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
        *(undefined8 *)(puVar9 + 0x10) =
             *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
        *(undefined8 *)(puVar9 + 0x18) = uVar4;
        *(undefined8 *)puVar9 = uVar2;
        *(undefined8 *)(puVar9 + 8) = uVar3;
        session->session_id_len = 0x20;
      }
      pLVar11 = (session->local).crypt;
      if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar11->dtor)(session,&(session->local).crypt_abstract);
        pLVar11 = (session->local).crypt;
      }
      if (pLVar11->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar9 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x20,&session->abstract);
        if (puVar9 == (uchar *)0x0) {
          iVar5 = -1;
          goto switchD_00113e07_caseD_1;
        }
        pLVar11 = (session->local).crypt;
        if (pLVar11->iv_len != 0) {
          sVar19 = 0;
          do {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar16 = sVar19;
            puVar10 = puVar9;
            if (sVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"A",1);
              uVar16 = (ulong)session->session_id_len;
              puVar10 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar10,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + sVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
            sVar19 = sVar19 + 0x20;
            pLVar11 = (session->local).crypt;
          } while (sVar19 < (ulong)(long)pLVar11->iv_len);
        }
        puVar10 = (uchar *)(*session->alloc)((long)pLVar11->secret_len + 0x20,&session->abstract);
        if (puVar10 != (uchar *)0x0) {
          pLVar11 = (session->local).crypt;
          if (pLVar11->secret_len != 0) {
            sVar19 = 0;
            do {
              _libssh2_sha256_init((EVP_MD_CTX **)&s);
              EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                               (key_state->exchange_state).k_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
              uVar16 = sVar19;
              puVar18 = puVar10;
              if (sVar19 == 0) {
                EVP_DigestUpdate((EVP_MD_CTX *)s,"C",1);
                uVar16 = (ulong)session->session_id_len;
                puVar18 = session->session_id;
              }
              EVP_DigestUpdate((EVP_MD_CTX *)s,puVar18,uVar16);
              EVP_DigestFinal((EVP_MD_CTX *)s,puVar10 + sVar19,(uint *)0x0);
              EVP_MD_CTX_free(s);
              sVar19 = sVar19 + 0x20;
              pLVar11 = (session->local).crypt;
            } while (sVar19 < (ulong)(long)pLVar11->secret_len);
          }
          iVar5 = (*pLVar11->init)(session,pLVar11,puVar9,(int *)&server_public_key,puVar10,
                                   (int *)&server_host_key,1,&(session->local).crypt_abstract);
          puVar18 = puVar9;
          if (iVar5 == 0) {
            if ((int)server_public_key != 0) {
              explicit_bzero(puVar9,(long)((session->local).crypt)->iv_len);
              (*session->free)(puVar9,&session->abstract);
            }
            if ((int)server_host_key != 0) {
              explicit_bzero(puVar10,(long)((session->local).crypt)->secret_len);
              (*session->free)(puVar10,&session->abstract);
            }
            goto LAB_001146aa;
          }
LAB_001148b8:
          puVar9 = puVar10;
          (*session->free)(puVar18,&session->abstract);
        }
LAB_001149c2:
        (*session->free)(puVar9,&session->abstract);
LAB_001149c9:
        iVar5 = -5;
        goto switchD_00113e07_caseD_1;
      }
LAB_001146aa:
      pLVar11 = (session->remote).crypt;
      if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar11->dtor)(session,&(session->remote).crypt_abstract);
        pLVar11 = (session->remote).crypt;
      }
      if (pLVar11->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar9 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x20,&session->abstract);
        if (puVar9 == (uchar *)0x0) goto LAB_001149c9;
        pLVar11 = (session->remote).crypt;
        if (pLVar11->iv_len != 0) {
          sVar19 = 0;
          do {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar16 = sVar19;
            puVar10 = puVar9;
            if (sVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"B",1);
              uVar16 = (ulong)session->session_id_len;
              puVar10 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar10,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + sVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
            sVar19 = sVar19 + 0x20;
            pLVar11 = (session->remote).crypt;
          } while (sVar19 < (ulong)(long)pLVar11->iv_len);
        }
        puVar10 = (uchar *)(*session->alloc)((long)pLVar11->secret_len + 0x20,&session->abstract);
        if (puVar10 == (uchar *)0x0) goto LAB_001149c2;
        pLVar11 = (session->remote).crypt;
        if (pLVar11->secret_len != 0) {
          sVar19 = 0;
          do {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar16 = sVar19;
            puVar18 = puVar10;
            if (sVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"D",1);
              uVar16 = (ulong)session->session_id_len;
              puVar18 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar18,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar10 + sVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
            sVar19 = sVar19 + 0x20;
            pLVar11 = (session->remote).crypt;
          } while (sVar19 < (ulong)(long)pLVar11->secret_len);
        }
        iVar5 = (*pLVar11->init)(session,pLVar11,puVar9,(int *)&server_public_key,puVar10,
                                 (int *)&server_host_key,0,&(session->remote).crypt_abstract);
        puVar18 = puVar9;
        if (iVar5 != 0) goto LAB_001148b8;
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar9,(long)((session->remote).crypt)->iv_len);
          (*session->free)(puVar9,&session->abstract);
        }
        if ((int)server_host_key != 0) {
          explicit_bzero(puVar10,(long)((session->remote).crypt)->secret_len);
          (*session->free)(puVar10,&session->abstract);
        }
      }
      p_Var12 = (session->local).mac;
      if (p_Var12->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var12->dtor)(session,&(session->local).mac_abstract);
        p_Var12 = (session->local).mac;
      }
      if (p_Var12->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        server_public_key._0_4_ = 0;
        puVar9 = (uchar *)(*session->alloc)((long)p_Var12->key_len + 0x20,&session->abstract);
        if (puVar9 == (uchar *)0x0) goto LAB_001149c9;
        p_Var12 = (session->local).mac;
        if (p_Var12->key_len != 0) {
          sVar19 = 0;
          do {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar16 = sVar19;
            puVar10 = puVar9;
            if (sVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"E",1);
              uVar16 = (ulong)session->session_id_len;
              puVar10 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar10,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + sVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
            sVar19 = sVar19 + 0x20;
            p_Var12 = (session->local).mac;
          } while (sVar19 < (ulong)(long)p_Var12->key_len);
        }
        (*p_Var12->init)(session,puVar9,(int *)&server_public_key,&(session->local).mac_abstract);
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar9,(long)((session->local).mac)->key_len);
          (*session->free)(puVar9,&session->abstract);
        }
      }
      p_Var12 = (session->remote).mac;
      if (p_Var12->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var12->dtor)(session,&(session->remote).mac_abstract);
        p_Var12 = (session->remote).mac;
      }
      if (p_Var12->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        server_public_key._0_4_ = 0;
        puVar9 = (uchar *)(*session->alloc)((long)p_Var12->key_len + 0x20,&session->abstract);
        if (puVar9 == (uchar *)0x0) goto LAB_001149c9;
        p_Var12 = (session->remote).mac;
        if (p_Var12->key_len != 0) {
          sVar19 = 0;
          do {
            _libssh2_sha256_init((EVP_MD_CTX **)&s);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
            uVar16 = sVar19;
            puVar10 = puVar9;
            if (sVar19 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)s,"F",1);
              uVar16 = (ulong)session->session_id_len;
              puVar10 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)s,puVar10,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)s,puVar9 + sVar19,(uint *)0x0);
            EVP_MD_CTX_free(s);
            sVar19 = sVar19 + 0x20;
            p_Var12 = (session->remote).mac;
          } while (sVar19 < (ulong)(long)p_Var12->key_len);
        }
        (*p_Var12->init)(session,puVar9,(int *)&server_public_key,&(session->remote).mac_abstract);
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar9,(long)((session->remote).mac)->key_len);
          (*session->free)(puVar9,&session->abstract);
        }
      }
      pLVar13 = (session->local).comp;
      if (pLVar13 != (LIBSSH2_COMP_METHOD *)0x0) {
        if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          (*pLVar13->dtor)(session,1,&(session->local).comp_abstract);
          pLVar13 = (session->local).comp;
          if (pLVar13 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_00114d12;
        }
        if (pLVar13->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar7 = (*pLVar13->init)(session,1,&(session->local).comp_abstract);
          iVar5 = -5;
          if (iVar7 != 0) goto switchD_00113e07_caseD_1;
        }
      }
LAB_00114d12:
      pLVar13 = (session->remote).comp;
      iVar5 = 0;
      if (pLVar13 != (LIBSSH2_COMP_METHOD *)0x0) {
        if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar5 = 0;
          (*pLVar13->dtor)(session,0,&(session->remote).comp_abstract);
          pLVar13 = (session->remote).comp;
          if (pLVar13 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_00113e07_caseD_1;
        }
        iVar5 = 0;
        if (pLVar13->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar5 = (*pLVar13->init)(session,0,&(session->remote).comp_abstract);
          iVar5 = (uint)(iVar5 == 0) * 5 + -5;
        }
      }
    }
    else {
      pcVar15 = "Unexpected curve25519 server public key length";
LAB_00113fed:
      iVar5 = -10;
LAB_001148e0:
      iVar5 = _libssh2_error(session,iVar5,pcVar15);
    }
switchD_00113e07_caseD_1:
    BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
    (key_state->exchange_state).k = (BIGNUM *)0x0;
    puVar9 = (key_state->exchange_state).k_value;
    if (puVar9 != (uchar *)0x0) {
      (*session->free)(puVar9,&session->abstract);
      (key_state->exchange_state).k_value = (uchar *)0x0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_idle;
  }
  if (iVar5 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
switchD_00113c66_caseD_1:
  if (key_state->curve25519_public_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_public_key,0x20);
    (*session->free)(key_state->curve25519_public_key,&session->abstract);
    key_state->curve25519_public_key = (uchar *)0x0;
  }
  if (key_state->curve25519_private_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_private_key,0x20);
    (*session->free)(key_state->curve25519_private_key,&session->abstract);
    key_state->curve25519_private_key = (uchar *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  return iVar5;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

clean_exit:

    if(key_state->curve25519_public_key) {
        _libssh2_explicit_zero(key_state->curve25519_public_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_public_key);
        key_state->curve25519_public_key = NULL;
    }

    if(key_state->curve25519_private_key) {
        _libssh2_explicit_zero(key_state->curve25519_private_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_private_key);
        key_state->curve25519_private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}